

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::SetNodeIndex
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,int i,int64_t nodeindex)

{
  ostream *poVar1;
  
  if (9 < (uint)i) {
    poVar1 = std::operator<<((ostream *)&std::cout,"TPZGeoElRefLess::SetNodeIndex index error i = ")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  (this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[(uint)i] = nodeindex;
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::SetNodeIndex(int i,int64_t nodeindex){
	if(i<0 || i>(TGeo::NNodes - 1)){
		std::cout << "TPZGeoElRefLess::SetNodeIndex index error i = " << i << std::endl;
		return;
	}
	fGeo.fNodeIndexes[i] = nodeindex;
}